

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O1

int is_prime(uint64_t n)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  if (n == 1 || (n & 1) == 0) {
    bVar18 = n == 2;
  }
  else {
    uVar1 = n - 1;
    uVar10 = 2;
    lVar12 = -1;
    do {
      lVar11 = lVar12;
      uVar9 = uVar10;
      lVar12 = lVar11 + 1;
      uVar10 = uVar9 * 2;
    } while ((uVar9 * 2 - 1 & uVar1) == 0);
    lVar13 = 0;
    do {
      uVar10 = (&DAT_00102070)[lVar13];
      if (uVar10 < n) {
        uVar14 = 1;
        uVar16 = uVar1 / uVar9;
        if (uVar9 <= uVar1) {
          do {
            if ((uVar16 & 1) != 0) {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar10;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar14;
              uVar14 = __umodti3(SUB168(auVar2 * auVar5,0),SUB168(auVar2 * auVar5,8),n,0);
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar10;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar10;
            uVar10 = __umodti3(SUB168(auVar3 * auVar6,0),SUB168(auVar3 * auVar6,8),n,0);
            bVar18 = 1 < uVar16;
            uVar16 = uVar16 >> 1;
          } while (bVar18);
        }
        if (uVar14 != uVar1 && uVar14 != 1) {
          if (lVar11 + 2U < 2) {
            lVar17 = 0;
          }
          else {
            lVar17 = 0;
            lVar15 = lVar12;
            do {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar14;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar14;
              uVar14 = __umodti3(SUB168(auVar4 * auVar7,0),SUB168(auVar4 * auVar7,8),n);
              lVar17 = lVar17 + (ulong)(uVar1 != uVar14);
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
          if (lVar17 == lVar12) {
            iVar8 = 1;
            bVar18 = false;
            goto LAB_001019d1;
          }
        }
        iVar8 = 0;
        bVar18 = true;
      }
      else {
        iVar8 = 4;
        bVar18 = false;
      }
LAB_001019d1:
      if (!bVar18) goto LAB_001019e7;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 7);
    iVar8 = 4;
LAB_001019e7:
    bVar18 = iVar8 == 4;
  }
  return (int)bVar18;
}

Assistant:

int is_prime(uint64_t n) {
    if(n % 2 == 0 || n == 1)
        return n == 2 ? 1 : 0;

    // perform (deterministic) Miller-Rabin primality test

    uint64_t s = 1;
    uint64_t t = 2;
    while((n-1) % (t<<1) == 0) {
        s++;
        t <<= 1;
    }
    uint64_t d = (n-1) / t;

    // these bases should be sufficient to test all n < 2^64
    uint64_t bases[] = {2, 325, 9375, 28178, 450775, 9780504, 1795265022};

    for(size_t i = 0; i < 7; i++) {
        uint64_t a = bases[i];
        if(a >= n)
            break;

        uint64_t tmp = expmod(a, d, n);
        if(tmp != 1 && tmp != n-1) {
            size_t cnt = 0;
            for(uint64_t r = 1; r < s; r++) {
                tmp = mulmod(tmp, tmp, n);
                if(tmp != n-1)
                    cnt++;
            }
            if(cnt == s-1)
                return 0;
        }

    }

    return 1;
}